

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

string * google::protobuf::compiler::python::anon_unknown_0::ModuleName
                   (string *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  int iVar2;
  size_t sVar3;
  string *extraout_RAX;
  string *psVar4;
  string *psVar5;
  char *__s;
  string basename;
  undefined7 *local_68;
  string *local_60;
  undefined7 local_58;
  undefined4 uStack_51;
  undefined1 local_4d;
  string *local_48;
  long local_40;
  _Alloc_hider local_38;
  
  local_58 = 0x646f746f72702e;
  uStack_51 = 0x6c657665;
  local_60 = (string *)0xb;
  local_4d = 0;
  if (filename->_M_string_length < 0xb) {
    __s = ".proto";
  }
  else {
    local_68 = &local_58;
    iVar2 = std::__cxx11::string::compare
                      ((ulong)filename,filename->_M_string_length - 0xb,(string *)0xb);
    __s = ".proto";
    if (iVar2 == 0) {
      __s = ".protodevel";
    }
    if (local_68 != &local_58) {
      operator_delete(local_68,CONCAT17((undefined1)uStack_51,local_58) + 1);
    }
  }
  local_68 = &local_58;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s,__s + sVar3);
  psVar5 = (string *)filename->_M_string_length;
  if (local_60 <= psVar5) {
    iVar2 = std::__cxx11::string::compare((ulong)filename,(long)psVar5 - (long)local_60,local_60);
    psVar5 = (string *)filename->_M_string_length;
    if (iVar2 == 0) {
      std::__cxx11::string::substr((ulong)&local_48,(ulong)filename);
      goto LAB_001642cb;
    }
  }
  local_48 = (string *)&local_38;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,pcVar1,psVar5 + (long)pcVar1);
LAB_001642cb:
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT17((undefined1)uStack_51,local_58) + 1);
  }
  google::protobuf::StripString((string *)&local_48,"-",'_');
  google::protobuf::StripString((string *)&local_48,"/",'.');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_48,
             (long)&(local_48->_M_dataplus)._M_p + local_40);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  psVar4 = (string *)&local_38;
  if (local_48 != psVar4) {
    operator_delete(local_48,(ulong)(local_38._M_p + 1));
    psVar4 = extraout_RAX;
  }
  return psVar4;
}

Assistant:

string ModuleName(const string& filename) {
  string basename = StripProto(filename);
  StripString(&basename, "-", '_');
  StripString(&basename, "/", '.');
  return basename + "_pb2";
}